

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O2

void __thiscall QReadWriteLock::unlock(QReadWriteLock *this)

{
  int iVar1;
  QReadWriteLockPrivate *pQVar2;
  QReadWriteLockPrivate *this_00;
  bool bVar3;
  
  this_00 = (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p;
  while( true ) {
    while (this_00 < (QReadWriteLockPrivate *)0x3) {
      LOCK();
      pQVar2 = (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p;
      bVar3 = this_00 == pQVar2;
      if (bVar3) {
        (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p =
             (__pointer_type)0x0;
        pQVar2 = this_00;
      }
      UNLOCK();
      this_00 = pQVar2;
      if (bVar3) {
        return;
      }
    }
    if (((uint)this_00 & 3) != 1) break;
    LOCK();
    pQVar2 = (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p;
    bVar3 = this_00 == pQVar2;
    if (bVar3) {
      (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p =
           (__pointer_type)&this_00[-1].field_0x1f0;
      pQVar2 = this_00;
    }
    UNLOCK();
    this_00 = pQVar2;
    if (bVar3) {
      return;
    }
  }
  if (this_00->recursive == true) {
    QReadWriteLockPrivate::recursiveUnlock(this_00);
    return;
  }
  std::mutex::lock(&this_00->mutex);
  if (this_00->writerCount == 0) {
    iVar1 = this_00->readerCount;
    this_00->readerCount = iVar1 + -1;
    if (1 < iVar1) goto LAB_00380551;
  }
  else {
    this_00->writerCount = 0;
  }
  if ((this_00->waitingReaders == 0) && (this_00->waitingWriters == 0)) {
    (this->d_ptr).super_QBasicAtomicPointer<QReadWriteLockPrivate>._q_value._M_b._M_p =
         (__pointer_type)0x0;
    QReadWriteLockPrivate::release(this_00);
  }
  else {
    QReadWriteLockPrivate::unlock(this_00);
  }
LAB_00380551:
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex);
  return;
}

Assistant:

void QReadWriteLock::unlock()
{
    QReadWriteLockPrivate *d = d_ptr.loadAcquire();
    while (true) {
        Q_ASSERT_X(d, "QReadWriteLock::unlock()", "Cannot unlock an unlocked lock");

        // Fast case: no contention: (no waiters, no other readers)
        if (quintptr(d) <= 2) { // 1 or 2 (StateLockedForRead or StateLockedForWrite)
            if (!d_ptr.testAndSetOrdered(d, nullptr, d))
                continue;
            return;
        }

        if ((quintptr(d) & StateMask) == StateLockedForRead) {
            Q_ASSERT(quintptr(d) > (1U<<4)); //otherwise that would be the fast case
            // Just decrease the reader's count.
            auto val = reinterpret_cast<QReadWriteLockPrivate *>(quintptr(d) - (1U<<4));
            if (!d_ptr.testAndSetOrdered(d, val, d))
                continue;
            return;
        }

        Q_ASSERT(!isUncontendedLocked(d));

        if (d->recursive) {
            d->recursiveUnlock();
            return;
        }

        const auto lock = qt_scoped_lock(d->mutex);
        if (d->writerCount) {
            Q_ASSERT(d->writerCount == 1);
            Q_ASSERT(d->readerCount == 0);
            d->writerCount = 0;
        } else {
            Q_ASSERT(d->readerCount > 0);
            d->readerCount--;
            if (d->readerCount > 0)
                return;
        }

        if (d->waitingReaders || d->waitingWriters) {
            d->unlock();
        } else {
            Q_ASSERT(d_ptr.loadRelaxed() == d); // should not change when we still hold the mutex
            d_ptr.storeRelease(nullptr);
            d->release();
        }
        return;
    }
}